

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_collision_bench.cc
# Opt level: O2

void RandomCommand(char **s)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = random();
  pcVar2 = (char *)operator_new__((long)(int)uVar1);
  *s = pcVar2;
  uVar4 = 0;
  uVar5 = uVar1 & 0xffffffff;
  if ((int)uVar1 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    lVar3 = random();
    (*s)[uVar4] = (char)lVar3;
  }
  return;
}

Assistant:

void RandomCommand(char** s) {
  int len = random(5, 100);
  *s = new char[len];
  for (int i = 0; i < len; ++i)
    (*s)[i] = (char)random(32, 127);
}